

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O3

void __thiscall
feintrack::SimpleLeftObjectsDetector::IncTimeShadyLeftObjects
          (SimpleLeftObjectsDetector *this,uint obj_uid)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)&this->shady_left_objects;
  do {
    p_Var1 = (((_List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_> *)
              &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)&this->shady_left_objects) {
      return;
    }
  } while (*(uint *)((long)&p_Var1[2]._M_next + 4) != obj_uid);
  *(int *)&p_Var1[1]._M_next = *(int *)&p_Var1[1]._M_next + 1;
  return;
}

Assistant:

void SimpleLeftObjectsDetector::IncTimeShadyLeftObjects(
        unsigned int obj_uid
        )
{
    for (auto& obj : shady_left_objects)
    {
        if (obj.obj_uid == obj_uid)
        {
            obj.life_time++;
            return;
        }
    }
}